

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

CharacterCounts __thiscall
ON_XMLNode::WriteToStreamEx
          (ON_XMLNode *this,wchar_t *stream,ON__UINT32 max_chars,bool includeFormatting,
          bool forceLongFormat,bool sortedProperties)

{
  int iVar1;
  undefined4 extraout_var;
  uint *puVar2;
  undefined4 extraout_var_00;
  ON__UINT32 extraout_var_01;
  int local_78 [2];
  ulong local_70;
  int local_60 [2];
  undefined1 local_58 [8];
  CharacterCounts cc;
  lock_guard<std::recursive_mutex> local_38;
  lock_guard<std::recursive_mutex> lg;
  bool sortedProperties_local;
  bool forceLongFormat_local;
  bool includeFormatting_local;
  wchar_t *pwStack_28;
  ON__UINT32 max_chars_local;
  wchar_t *stream_local;
  ON_XMLNode *this_local;
  CharacterCounts counts;
  
  lg._M_device._1_1_ = sortedProperties;
  lg._M_device._2_1_ = forceLongFormat;
  lg._M_device._3_1_ = includeFormatting;
  lg._M_device._4_4_ = max_chars;
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_38,&this->_private->m_mutex);
  CharacterCounts::CharacterCounts((CharacterCounts *)&this_local);
  if ((lg._M_device._4_4_ == 0) || (stream != (wchar_t *)0x0)) {
    iVar1 = (*this->_vptr_ON_XMLNode[0x1d])
                      (this,stream,(ulong)lg._M_device._4_4_,(ulong)(lg._M_device._3_1_ & 1),
                       (ulong)(lg._M_device._2_1_ & 1),(ulong)(lg._M_device._1_1_ & 1));
    local_58 = (undefined1  [8])CONCAT44(extraout_var,iVar1);
    CharacterCounts::operator+=((CharacterCounts *)&this_local,(CharacterCounts *)local_58);
    pwStack_28 = stream;
    if (stream != (wchar_t *)0x0) {
      pwStack_28 = stream + ((ulong)local_58 >> 0x20);
    }
    local_60[1] = 0;
    local_60[0] = lg._M_device._4_4_ - local_58._0_4_;
    puVar2 = (uint *)std::max<int>(local_60 + 1,local_60);
    lg._M_device._4_4_ = *puVar2;
    iVar1 = (*this->_vptr_ON_XMLNode[0x1e])
                      (this,pwStack_28,(ulong)lg._M_device._4_4_,(ulong)(lg._M_device._3_1_ & 1),
                       (ulong)(lg._M_device._2_1_ & 1),(ulong)(lg._M_device._1_1_ & 1));
    local_70 = CONCAT44(extraout_var_00,iVar1);
    local_58 = (undefined1  [8])local_70;
    CharacterCounts::operator+=((CharacterCounts *)&this_local,(CharacterCounts *)local_58);
    if (pwStack_28 != (wchar_t *)0x0) {
      pwStack_28 = pwStack_28 + ((ulong)local_58 >> 0x20);
    }
    local_78[1] = 0;
    local_78[0] = lg._M_device._4_4_ - local_58._0_4_;
    puVar2 = (uint *)std::max<int>(local_78 + 1,local_78);
    lg._M_device._4_4_ = *puVar2;
    local_58._0_4_ =
         (*this->_vptr_ON_XMLNode[0x1f])
                   (this,pwStack_28,(ulong)lg._M_device._4_4_,(ulong)(lg._M_device._3_1_ & 1),
                    (ulong)(lg._M_device._2_1_ & 1));
    local_58._4_4_ = extraout_var_01;
    CharacterCounts::operator+=((CharacterCounts *)&this_local,(CharacterCounts *)local_58);
  }
  else {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
               ,0xd24,"","\'stream\' cannot be null when \'max_chars\' is non-zero");
  }
  cc._reserved._0_4_ = 1;
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_38);
  return _this_local;
}

Assistant:

ON_XMLNode::CharacterCounts ON_XMLNode::WriteToStreamEx(wchar_t* stream, ON__UINT32 max_chars, bool includeFormatting, bool forceLongFormat, bool sortedProperties) const
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  CharacterCounts counts;

  if ((0 != max_chars) && (nullptr == stream))
  {
    ON_ERROR("'stream' cannot be null when 'max_chars' is non-zero");
    return counts;
  }

  auto cc = WriteHeaderToStream(stream, max_chars, includeFormatting, forceLongFormat, sortedProperties);
  counts += cc;
  if (nullptr != stream)
    stream += cc._physical;

  max_chars = std::max(0, int(max_chars - cc._logical));

  cc = WriteChildrenToStream(stream, max_chars, includeFormatting, forceLongFormat, sortedProperties);
  counts += cc;
  if (nullptr != stream)
    stream += cc._physical;

  max_chars = std::max(0, int(max_chars - cc._logical));

  cc = WriteFooterToStream(stream, max_chars, includeFormatting, forceLongFormat);
  counts += cc;

  return counts;
}